

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcole.c
# Opt level: O2

int ffr4fi1(float *input,long ntodo,double scale,double zero,uchar *output,int *status)

{
  float fVar1;
  long lVar2;
  long lVar3;
  uchar uVar4;
  double dVar5;
  
  lVar2 = 0;
  if (0 < ntodo) {
    lVar2 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      dVar5 = ((double)input[lVar3] - zero) / scale;
      if (-0.49 <= dVar5) {
        if (dVar5 <= 255.49) {
          uVar4 = (uchar)(int)(dVar5 + 0.5);
        }
        else {
          *status = -0xb;
          uVar4 = 0xff;
        }
      }
      else {
        *status = -0xb;
        uVar4 = '\0';
      }
      output[lVar3] = uVar4;
    }
  }
  else {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      fVar1 = input[lVar3];
      if (-0.49 <= fVar1) {
        if (fVar1 <= 255.49) {
          uVar4 = (uchar)(int)fVar1;
        }
        else {
          *status = -0xb;
          uVar4 = 0xff;
        }
      }
      else {
        *status = -0xb;
        uVar4 = '\0';
      }
      output[lVar3] = uVar4;
    }
  }
  return *status;
}

Assistant:

int ffr4fi1(float *input,          /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            unsigned char *output, /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (input[ii] > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (dvalue > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) (dvalue + .5);
        }
    }
    return(*status);
}